

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::SymIsIntconstOrSelf(BackwardPass *this,Sym *sym,Opnd *opnd)

{
  Sym *pSVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  
  if (sym->m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1e25,"(sym->IsStackSym())","sym->IsStackSym()");
    if (!bVar3) goto LAB_003e8e4d;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar4 == OpndKindReg) {
    OVar4 = IR::Opnd::GetKind(opnd);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_003e8e4d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pSVar1 = (Sym *)opnd[1]._vptr_Opnd;
    if (pSVar1 == sym) {
      return true;
    }
    if ((*(long *)&pSVar1[1].m_id != 0 & *(byte *)&pSVar1[1]._vptr_Sym) == 1) {
      return *(short *)(*(long *)&pSVar1[1].m_id + 0x30) == 0x1e5;
    }
  }
  return false;
}

Assistant:

bool 
BackwardPass::SymIsIntconstOrSelf(Sym *sym, IR::Opnd *opnd)
{
    Assert(sym->IsStackSym());
    if (!opnd->IsRegOpnd())
    {
        return false;
    }
    StackSym *opndSym = opnd->AsRegOpnd()->m_sym;

    if (sym == opndSym)
    {
        return true;
    }

    if (!opndSym->IsSingleDef())
    {
        return false;
    }

    if (opndSym->GetInstrDef()->m_opcode == Js::OpCode::LdC_A_I4)
    {
        return true;
    }

    return false;
}